

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::IsAddressFromAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,void *address)

{
  code *pcVar1;
  undefined1 this_00 [8];
  NodeBase *pNVar2;
  NodeBase *this_01;
  bool bVar3;
  undefined4 *puVar4;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar5;
  DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *node;
  SegmentBase<Memory::VirtualAllocWrapper> *segment;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar6;
  undefined1 local_a0 [8];
  Iterator decommitSegmentsIterator;
  Iterator largeSegmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator segmentsIterator;
  void *address_local;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_local;
  
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Iterator
            ((Iterator *)&fullSegmentsIterator.current,
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).segments);
  while( true ) {
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pNVar2 = fullSegmentsIterator.current;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                       (&(segmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>)
    ;
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                      ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *
                       )pNVar2,pDVar5);
    if (bVar3) break;
    segmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                   (&(segmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&fullSegmentsIterator.current);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar6);
    if (bVar3) {
      return true;
    }
  }
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Iterator
            ((Iterator *)&largeSegmentsIterator.current,
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).fullSegments);
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_01 = largeSegmentsIterator.current;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                       (&(fullSegmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>)
    ;
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                      ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *
                       )this_01,pDVar5);
    if (bVar3) break;
    fullSegmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                   (&(fullSegmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&largeSegmentsIterator.current);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar6);
    if (bVar3) {
      return true;
    }
  }
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Iterator
            ((Iterator *)&decommitSegmentsIterator.current,
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).largeSegments);
  while( true ) {
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pNVar2 = decommitSegmentsIterator.current;
    node = DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>::Next
                     (&(largeSegmentsIterator.list)->
                       super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>);
    bVar3 = DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                      ((DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
                       pNVar2,node);
    if (bVar3) break;
    largeSegmentsIterator.list =
         (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>::Next
                   (&(largeSegmentsIterator.list)->
                     super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>);
    segment = DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Data
                        ((Iterator *)&decommitSegmentsIterator.current);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,segment);
    if (bVar3) {
      return true;
    }
  }
  largeSegmentsIterator.list =
       (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Iterator
            ((Iterator *)local_a0,
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).decommitSegments);
  while( true ) {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = local_a0;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                       (&(decommitSegmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>)
    ;
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                      ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *
                       )this_00,pDVar5);
    if (bVar3) break;
    decommitSegmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                   (&(decommitSegmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)local_a0);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar6);
    if (bVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
HeapPageAllocator<T>::IsAddressFromAllocator(__in void* address)
{
    typename DListBase<PageSegmentBase<T>>::Iterator segmentsIterator(&this->segments);
    while (segmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, segmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator fullSegmentsIterator(&this->fullSegments);
    while (fullSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, fullSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<SegmentBase<T>>::Iterator largeSegmentsIterator(&this->largeSegments);
    while (largeSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, largeSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator decommitSegmentsIterator(&this->decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, decommitSegmentsIterator.Data()))
        {
            return true;
        }
    }

    return false;
}